

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  int iVar1;
  LogMessage *pLVar2;
  undefined4 extraout_var;
  StringOutputStream output_stream;
  TextGenerator generator;
  StringOutputStream SStack_b8;
  TextGenerator local_a8;
  LogMessage local_68;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x65f);
    pLVar2 = internal::LogMessage::operator<<(&local_68,"CHECK failed: output: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is NULL");
    internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&SStack_b8,output);
  TextGenerator::TextGenerator
            (&local_a8,&SStack_b8.super_ZeroCopyOutputStream,this->initial_indent_level_);
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  PrintFieldValue(this,message,(Reflection *)CONCAT44(extraout_var,iVar1),field,index,&local_a8);
  TextGenerator::~TextGenerator(&local_a8);
  io::StringOutputStream::~StringOutputStream(&SStack_b8);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(
    const Message& message,
    const FieldDescriptor* field,
    int index,
    string* output) const {

  GOOGLE_DCHECK(output) << "output specified is NULL";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, generator);
}